

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_riff_midi.cpp
# Opt level: O0

bool midi_processor::process_riff_midi_count
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,size_t *track_count)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  byte bVar4;
  uchar uVar5;
  uchar uVar6;
  bool bVar7;
  uint uVar8;
  const_reference pvVar9;
  difference_type dVar10;
  byte *pbVar11;
  reference puVar12;
  ulong uVar13;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b8;
  uchar *local_b0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a8;
  undefined1 local_a0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> midi_file;
  uint32_t chunk_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> extra_buffer;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  const_iterator body_end;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  const_iterator it;
  uint32_t file_size;
  size_t *track_count_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file_local;
  
  *track_count = 0;
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,4);
  vVar1 = *pvVar9;
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,5);
  vVar2 = *pvVar9;
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,6);
  vVar3 = *pvVar9;
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](p_file,7);
  it._M_current._4_4_ = CONCAT13(*pvVar9,CONCAT12(vVar3,CONCAT11(vVar2,vVar1)));
  body_end = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(p_file);
  local_30 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&body_end,0xc);
  extra_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(p_file);
  local_48 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&extra_buffer.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,8);
  local_40 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_48,(ulong)it._M_current._4_4_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&chunk_size);
  do {
    bVar7 = __gnu_cxx::operator!=(&local_30,&local_40);
    if (!bVar7) {
      p_file_local._7_1_ = false;
LAB_0012b1ea:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&chunk_size);
      return p_file_local._7_1_;
    }
    dVar10 = __gnu_cxx::operator-(&local_40,&local_30);
    if (dVar10 < 8) {
      p_file_local._7_1_ = false;
      goto LAB_0012b1ea;
    }
    pbVar11 = __gnu_cxx::
              __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator[](&local_30,4);
    bVar4 = *pbVar11;
    puVar12 = __gnu_cxx::
              __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator[](&local_30,5);
    uVar5 = *puVar12;
    puVar12 = __gnu_cxx::
              __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator[](&local_30,6);
    uVar6 = *puVar12;
    puVar12 = __gnu_cxx::
              __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator[](&local_30,7);
    uVar8 = CONCAT13(*puVar12,CONCAT12(uVar6,CONCAT11(uVar5,bVar4)));
    uVar13 = __gnu_cxx::operator-(&local_40,&local_30);
    if (uVar13 < uVar8) {
      p_file_local._7_1_ = false;
      goto LAB_0012b1ea;
    }
    bVar7 = it_equal((const_iterator)local_30._M_current,"data",4);
    if (bVar7) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
      local_a8 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator+(&local_30,8);
      local_b8 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator+(&local_30,8);
      local_b0 = (uchar *)__gnu_cxx::
                          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ::operator+(&local_b8,(ulong)uVar8);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      assign<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_a0,local_a8,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )local_b0);
      p_file_local._7_1_ =
           process_standard_midi_count
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0,track_count)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a0);
      goto LAB_0012b1ea;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+=(&local_30,(ulong)uVar8);
    if (((bVar4 & 1) != 0) && (bVar7 = __gnu_cxx::operator!=(&local_30,&local_40), bVar7)) {
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_30);
    }
  } while( true );
}

Assistant:

bool midi_processor::process_riff_midi_count( std::vector<uint8_t> const& p_file, size_t & track_count )
{
    track_count = 0;

    uint32_t file_size = p_file[ 4 ] | ( p_file[ 5 ] << 8 ) | ( p_file[ 6 ] << 16 ) | ( p_file[ 7 ] << 24 );

    std::vector<uint8_t>::const_iterator it = p_file.begin() + 12;

    std::vector<uint8_t>::const_iterator body_end = p_file.begin() + 8 + file_size;

    std::vector<uint8_t> extra_buffer;

    while ( it != body_end )
    {
        if ( body_end - it < 8 ) return false;
        uint32_t chunk_size = it[ 4 ] | ( it[ 5 ] << 8 ) | ( it[ 6 ] << 16 ) | ( it[ 7 ] << 24 );
        if ( (unsigned long)(body_end - it) < chunk_size ) return false;
        if ( it_equal(it, "data", 4) )
        {
            std::vector<uint8_t> midi_file;
            midi_file.assign( it + 8, it + 8 + chunk_size );
            return process_standard_midi_count( midi_file, track_count );
        }
        else
        {
            it += chunk_size;
            if ( chunk_size & 1 && it != body_end ) ++it;
        }
    }

    return false;
}